

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall BailOutInfo::Clear(BailOutInfo *this,JitArenaAllocator *allocator)

{
  CapturedValues *pCVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint *obj;
  CapturedValues *pCVar7;
  Type pSVar8;
  CapturedValues *pCVar9;
  
  if (this->bailOutRecord != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x60,
                       "(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind))"
                       ,
                       "bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind)"
                      );
    if (!bVar4) goto LAB_003e1536;
    *puVar6 = 0;
  }
  if ((this->capturedValues != (CapturedValues *)0x0) &&
     (uVar5 = CapturedValues::DecrementRefCount(this->capturedValues), uVar5 == 0)) {
    pCVar9 = this->capturedValues;
    pCVar7 = (CapturedValues *)
             (pCVar9->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (pCVar7 != pCVar9) {
      pCVar1 = (CapturedValues *)
               (pCVar7->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pCVar7,0x20);
      pCVar7 = pCVar1;
    }
    (pCVar9->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar9;
    (pCVar9->constantValues).super_RealCount.count = 0;
    pCVar9 = this->capturedValues;
    pSVar8 = (pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while ((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)pSVar8 != &pCVar9->copyPropSyms) {
      pSVar2 = pSVar8->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pSVar8,0x18);
      pSVar8 = pSVar2;
    }
    (pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &(pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
    (pCVar9->copyPropSyms).super_RealCount.count = 0;
    pCVar9 = this->capturedValues;
    if (pCVar9->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,pCVar9->argObjSyms);
      pCVar9 = this->capturedValues;
    }
    Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,CapturedValues>
              (allocator,pCVar9);
  }
  pCVar9 = this->usedCapturedValues;
  if (pCVar9 != (CapturedValues *)0x0) {
    if (pCVar9->refCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70,"(this->usedCapturedValues->refCount == 0)",
                         "this->usedCapturedValues->refCount == 0");
      if (!bVar4) goto LAB_003e1536;
      *puVar6 = 0;
      pCVar9 = this->usedCapturedValues;
    }
    pCVar7 = (CapturedValues *)
             (pCVar9->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (pCVar7 != pCVar9) {
      pCVar1 = (CapturedValues *)
               (pCVar7->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pCVar7,0x20);
      pCVar7 = pCVar1;
    }
    (pCVar9->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar9;
    (pCVar9->constantValues).super_RealCount.count = 0;
    pCVar9 = this->usedCapturedValues;
    pSVar8 = (pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while ((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)pSVar8 != &pCVar9->copyPropSyms) {
      pSVar2 = pSVar8->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pSVar8,0x18);
      pSVar8 = pSVar2;
    }
    (pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &(pCVar9->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
    (pCVar9->copyPropSyms).super_RealCount.count = 0;
    pCVar9 = this->usedCapturedValues;
    if (pCVar9->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,pCVar9->argObjSyms);
      pCVar9 = this->usedCapturedValues;
    }
    Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,CapturedValues>
              (allocator,pCVar9);
  }
  if (this->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->byteCodeUpwardExposedUsed);
  }
  obj = this->startCallInfo;
  if (obj != (uint *)0x0) {
    if (this->argOutSyms == (StackSym **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x82,"(argOutSyms)","argOutSyms");
      if (!bVar4) {
LAB_003e1536:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      obj = this->startCallInfo;
    }
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int>
              (allocator,(ulong)this->startCallCount,obj);
    Memory::DeleteArray<Memory::JitArenaAllocator,StackSym*>
              (allocator,(ulong)this->totalOutParamCount,this->argOutSyms);
  }
  if (this->liveVarSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    return;
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveVarSyms);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveLosslessInt32Syms);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveFloat64Syms);
  return;
}

Assistant:

void
BailOutInfo::Clear(JitArenaAllocator * allocator)
{
    // Previously, we don't have a case where we delete bailout info after we allocated the bailout record.
    // However, since lazy bailouts can now be attached on helper call instructions, and those instructions
    // might sometimes be removed in Peeps, we will hit those cases. Make sure that in such cases, lazy bailout
    // is the only bailout reason we have.
    Assert(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind));
    if (this->capturedValues && this->capturedValues->DecrementRefCount() == 0)
    {
        this->capturedValues->constantValues.Clear(allocator);
        this->capturedValues->copyPropSyms.Clear(allocator);

        if (this->capturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->capturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->capturedValues);
    }

    if (this->usedCapturedValues)
    {
        Assert(this->usedCapturedValues->refCount == 0);
        this->usedCapturedValues->constantValues.Clear(allocator);
        this->usedCapturedValues->copyPropSyms.Clear(allocator);

        if (this->usedCapturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->usedCapturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->usedCapturedValues);
    }

    if (byteCodeUpwardExposedUsed)
    {
        JitAdelete(allocator, byteCodeUpwardExposedUsed);
    }
    if (startCallInfo)
    {
        Assert(argOutSyms);
        JitAdeleteArray(allocator, startCallCount, startCallInfo);
        JitAdeleteArray(allocator, totalOutParamCount, argOutSyms);
    }
    if (liveVarSyms)
    {
        JitAdelete(allocator, liveVarSyms);
        JitAdelete(allocator, liveLosslessInt32Syms);
        JitAdelete(allocator, liveFloat64Syms);
    }
#ifdef _M_IX86
    if (outParamFrameAdjustArgSlot)
    {
        JitAdelete(allocator, outParamFrameAdjustArgSlot);
    }
#endif
}